

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void duckdb::ReservoirQuantileScalarOperation::Finalize<long,duckdb::ReservoirQuantileState<long>>
               (ReservoirQuantileState<long> *state,long *target,
               AggregateFinalizeData *finalize_data)

{
  long *__first;
  FunctionData *pFVar1;
  reference pvVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  if (state->pos != 0) {
    pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    __first = state->v;
    lVar4 = state->pos - 1;
    auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = 0x45300000;
    pvVar2 = vector<double,_true>::get<true>((vector<double,_true> *)(pFVar1 + 1),0);
    dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * *pvVar2;
    uVar3 = (ulong)dVar5;
    ::std::nth_element<long*>
              (__first,__first + ((long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f |
                                 uVar3),__first + state->pos);
    *target = __first[(long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3];
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(state.v);
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ReservoirQuantileBindData>();
		auto v_t = state.v;
		D_ASSERT(bind_data.quantiles.size() == 1);
		auto offset = (idx_t)((double)(state.pos - 1) * bind_data.quantiles[0]);
		std::nth_element(v_t, v_t + offset, v_t + state.pos);
		target = v_t[offset];
	}